

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O3

void QLibraryStore::cleanup(EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  QLibraryStore *this;
  QTextStream *pQVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  storage_type *psVar5;
  LibraryMap *__range1;
  char16_t *begin;
  QLibraryPrivate *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QTextStream *local_58;
  QString local_50;
  long local_38;
  
  this = qt_library_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (qt_library_data != (QLibraryStore *)0x0) {
    p_Var1 = &(qt_library_data->libraryMap)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var3 = (qt_library_data->libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; (_Rb_tree_header *)p_Var3 != p_Var1;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      this_00 = (QLibraryPrivate *)p_Var3[1]._M_right;
      if ((this_00->libraryRefCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 1) {
        if ((this_00->libraryUnloadCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
            _q_value.super___atomic_base<int>._M_i < 1) {
          p_Var3[1]._M_right = (_Base_ptr)0x0;
LAB_0049529e:
          QLibraryPrivate::~QLibraryPrivate(this_00);
        }
        else {
          (this_00->libraryUnloadCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i = 1;
          QLibraryPrivate::unload((QLibraryPrivate *)p_Var3[1]._M_right,UnloadSys);
          this_00 = (QLibraryPrivate *)p_Var3[1]._M_right;
          p_Var3[1]._M_right = (_Base_ptr)0x0;
          if (this_00 != (QLibraryPrivate *)0x0) goto LAB_0049529e;
          this_00 = (QLibraryPrivate *)0x0;
        }
        operator_delete(this_00,0xb0);
      }
    }
    lcDebugLibrary();
    if ((((byte)lcDebugLibrary::category.super_QLoggingCategory.field_2.bools.enabledDebug._q_value.
                _M_base._M_i & 1) != 0) &&
       (p_Var4 = (this->libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
       (_Rb_tree_header *)p_Var4 != p_Var1)) {
      do {
        if ((p_Var4[1]._M_right != (_Base_ptr)0x0) &&
           (lcDebugLibrary(),
           ((byte)lcDebugLibrary::category.super_QLoggingCategory.field_2.bools.enabledDebug.
                  _q_value._M_base._M_i & 1) != 0)) {
          psVar5 = (storage_type *)&local_74;
          local_74 = 0;
          uStack_6c = 0;
          local_64 = 0;
          local_60 = lcDebugLibrary::category.super_QLoggingCategory.name;
          QMessageLogger::debug((QMessageLogger *)&local_58);
          pQVar2 = local_58;
          ba.m_data = psVar5;
          ba.m_size = (qsizetype)"On QtCore unload,";
          QString::fromUtf8(&local_50,(QString *)0x11,ba);
          ::QTextStream::operator<<(pQVar2,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(char *)&local_58[3]._vptr_QTextStream == '\x01') {
            ::QTextStream::operator<<(local_58,' ');
          }
          begin = (char16_t *)(p_Var4[1]._M_right)->_M_parent;
          if ((_Base_ptr)begin == (_Base_ptr)0x0) {
            begin = &QString::_empty;
          }
          QDebug::putString((QDebug *)&local_58,(QChar *)begin,(size_t)(p_Var4[1]._M_right)->_M_left
                           );
          if (*(char *)&local_58[3]._vptr_QTextStream == '\x01') {
            ::QTextStream::operator<<(local_58,' ');
          }
          pQVar2 = local_58;
          ba_00.m_data = psVar5;
          ba_00.m_size = (qsizetype)"was leaked, with";
          QString::fromUtf8(&local_50,(QString *)0x10,ba_00);
          ::QTextStream::operator<<(pQVar2,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(char *)&local_58[3]._vptr_QTextStream == '\x01') {
            ::QTextStream::operator<<(local_58,' ');
          }
          ::QTextStream::operator<<(local_58,*(int *)&p_Var4[1]._M_right[5].field_0x4);
          if (*(char *)&local_58[3]._vptr_QTextStream == '\x01') {
            ::QTextStream::operator<<(local_58,' ');
          }
          pQVar2 = local_58;
          ba_01.m_data = psVar5;
          ba_01.m_size = (qsizetype)"users";
          QString::fromUtf8(&local_50,(QString *)0x5,ba_01);
          ::QTextStream::operator<<(pQVar2,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(char *)&local_58[3]._vptr_QTextStream == '\x01') {
            ::QTextStream::operator<<(local_58,' ');
          }
          QDebug::~QDebug((QDebug *)&local_58);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    qt_library_data = (QLibraryStore *)0x0;
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QLibraryPrivate_*>,_std::_Select1st<std::pair<const_QString,_QLibraryPrivate_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
    ::~_Rb_tree((_Rb_tree<QString,_std::pair<const_QString,_QLibraryPrivate_*>,_std::_Select1st<std::pair<const_QString,_QLibraryPrivate_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
                 *)this);
    operator_delete(this,0x30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QLibraryStore::cleanup()
{
    QLibraryStore *data = qt_library_data;
    if (!data)
        return;

    // find any libraries that are still loaded but have a no one attached to them
    for (auto &[_, lib] : data->libraryMap) {
        if (lib->libraryRefCount.loadRelaxed() == 1) {
            if (lib->libraryUnloadCount.loadRelaxed() > 0) {
                Q_ASSERT(lib->pHnd.loadRelaxed());
                lib->libraryUnloadCount.storeRelaxed(1);
#if defined(Q_OS_DARWIN)
                // We cannot fully unload libraries, as we don't know if there are
                // lingering references (in system threads e.g.) to Objective-C classes
                // defined in the library.
                lib->unload(QLibraryPrivate::NoUnloadSys);
#else
                lib->unload();
#endif
            }
            delete std::exchange(lib, nullptr);
        }
    }

    // dump all objects that remain
    if (lcDebugLibrary().isDebugEnabled()) {
        for (auto &[_, lib] : data->libraryMap) {
            if (lib)
                qCDebug(lcDebugLibrary)
                        << "On QtCore unload," << lib->fileName << "was leaked, with"
                        << lib->libraryRefCount.loadRelaxed() << "users";
        }
    }

    delete data;
}